

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TransitionObservationIndependentMADPDiscrete.h
# Opt level: O0

void __thiscall
TransitionObservationIndependentMADPDiscrete::GetOGet
          (TransitionObservationIndependentMADPDiscrete *this)

{
  TransitionObservationIndependentMADPDiscrete *in_stack_00000028;
  
  GetOGet(in_stack_00000028);
  return;
}

Assistant:

OGet* GetOGet() const
        {
            if(!_m_jointModelsGenerated)
                return 0;

            if(_m_sparse)
                return new OGet_ObservationModelMappingSparse(
                    ((ObservationModelMappingSparse*)_m_p_oModel)  ); 
            else
                return new OGet_ObservationModelMapping(
                    ((ObservationModelMapping*)_m_p_oModel)  );
        }